

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS
ref_cavity_form_edge_collapse(REF_CAVITY ref_cavity,REF_GRID ref_grid,REF_INT node0,REF_INT node1)

{
  REF_NODE pRVar1;
  REF_CELL pRVar2;
  bool bVar3;
  uint uVar4;
  bool bVar5;
  REF_INT local_fc;
  bool local_f7;
  REF_INT local_f4;
  int local_f0;
  REF_INT local_ec;
  bool local_e7;
  REF_INT local_e4;
  int local_e0;
  REF_INT local_dc;
  bool local_d7;
  REF_INT local_d4;
  int local_d0;
  REF_INT local_cc;
  bool local_c7;
  REF_INT local_c4;
  int local_c0;
  REF_STATUS ref_private_macro_code_rsb_1;
  REF_STATUS ref_private_macro_code_rsb;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL has_node1;
  REF_BOOL has_node0;
  REF_BOOL already_have_it;
  REF_BOOL will_be_collapsed;
  REF_INT seg_nodes [3];
  REF_INT face_nodes [3];
  REF_INT node;
  REF_INT cell_face;
  REF_INT cell;
  REF_INT item;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  REF_CAVITY ref_cavity_local;
  
  pRVar1 = ref_grid->node;
  ref_cavity_local._4_4_ = ref_cavity_form_empty(ref_cavity,ref_grid,node0);
  if (ref_cavity_local._4_4_ == 0) {
    if ((pRVar1->ref_mpi->id == pRVar1->part[node0]) && (pRVar1->ref_mpi->id == pRVar1->part[node1])
       ) {
      if ((ref_grid->cell[9]->n < 1) && (ref_grid->cell[10]->n < 1)) {
        ref_cavity->collapse_node0 = node0;
        ref_cavity->collapse_node1 = node1;
        pRVar2 = ref_grid->cell[8];
        if ((node0 < 0) || (pRVar2->ref_adj->nnode <= node0)) {
          local_c0 = -1;
        }
        else {
          local_c0 = pRVar2->ref_adj->first[node0];
        }
        cell_face = local_c0;
        if (local_c0 == -1) {
          local_c4 = -1;
        }
        else {
          local_c4 = pRVar2->ref_adj->item[local_c0].ref;
        }
        node = local_c4;
        while (cell_face != -1) {
          uVar4 = ref_list_contains(ref_cavity->tet_list,node,&has_node1);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x5fb,"ref_cavity_form_edge_collapse",(ulong)uVar4,"have tet?");
            return uVar4;
          }
          if (has_node1 == 0) {
            uVar4 = ref_list_push(ref_cavity->tet_list,node);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x5fd,"ref_cavity_form_edge_collapse",(ulong)uVar4,"save tet");
              return uVar4;
            }
            local_c7 = false;
            bVar5 = false;
            for (face_nodes[1] = 0; face_nodes[1] < pRVar2->node_per;
                face_nodes[1] = face_nodes[1] + 1) {
              bVar3 = !local_c7;
              local_c7 = true;
              if (bVar3) {
                local_c7 = node0 == pRVar2->c2n[face_nodes[1] + pRVar2->size_per * node];
              }
              bVar3 = !bVar5;
              bVar5 = true;
              if (bVar3) {
                bVar5 = node1 == pRVar2->c2n[face_nodes[1] + pRVar2->size_per * node];
              }
              if (pRVar1->ref_mpi->id !=
                  pRVar1->part[pRVar2->c2n[face_nodes[1] + pRVar2->size_per * node]]) {
                ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
                return 0;
              }
            }
            local_c7 = local_c7 && bVar5;
            has_node0 = (REF_BOOL)local_c7;
            if (has_node0 == 0) {
              for (face_nodes[2] = 0; face_nodes[2] < pRVar2->face_per;
                  face_nodes[2] = face_nodes[2] + 1) {
                bVar5 = false;
                for (face_nodes[1] = 0; face_nodes[1] < 3; face_nodes[1] = face_nodes[1] + 1) {
                  seg_nodes[(long)face_nodes[1] + 1] =
                       pRVar2->c2n
                       [pRVar2->f2n[face_nodes[1] + face_nodes[2] * 4] + pRVar2->size_per * node];
                  bVar3 = !bVar5;
                  bVar5 = true;
                  if (bVar3) {
                    bVar5 = node0 == seg_nodes[(long)face_nodes[1] + 1];
                  }
                }
                if ((!bVar5) &&
                   (uVar4 = ref_cavity_insert_face(ref_cavity,seg_nodes + 1), uVar4 != 0)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0x611,"ref_cavity_form_edge_collapse",(ulong)uVar4,"tet face");
                  return uVar4;
                }
              }
            }
          }
          cell_face = pRVar2->ref_adj->item[cell_face].next;
          if (cell_face == -1) {
            local_cc = -1;
          }
          else {
            local_cc = pRVar2->ref_adj->item[cell_face].ref;
          }
          node = local_cc;
        }
        if ((node1 < 0) || (pRVar2->ref_adj->nnode <= node1)) {
          local_d0 = -1;
        }
        else {
          local_d0 = pRVar2->ref_adj->first[node1];
        }
        cell_face = local_d0;
        if (local_d0 == -1) {
          local_d4 = -1;
        }
        else {
          local_d4 = pRVar2->ref_adj->item[local_d0].ref;
        }
        node = local_d4;
        while (cell_face != -1) {
          uVar4 = ref_list_contains(ref_cavity->tet_list,node,&has_node1);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x618,"ref_cavity_form_edge_collapse",(ulong)uVar4,"have tet?");
            return uVar4;
          }
          if (has_node1 == 0) {
            uVar4 = ref_list_push(ref_cavity->tet_list,node);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x61a,"ref_cavity_form_edge_collapse",(ulong)uVar4,"save tet");
              return uVar4;
            }
            local_d7 = false;
            bVar5 = false;
            for (face_nodes[1] = 0; face_nodes[1] < pRVar2->node_per;
                face_nodes[1] = face_nodes[1] + 1) {
              bVar3 = !local_d7;
              local_d7 = true;
              if (bVar3) {
                local_d7 = node0 == pRVar2->c2n[face_nodes[1] + pRVar2->size_per * node];
              }
              bVar3 = !bVar5;
              bVar5 = true;
              if (bVar3) {
                bVar5 = node1 == pRVar2->c2n[face_nodes[1] + pRVar2->size_per * node];
              }
              if (pRVar1->ref_mpi->id !=
                  pRVar1->part[pRVar2->c2n[face_nodes[1] + pRVar2->size_per * node]]) {
                ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
                return 0;
              }
            }
            local_d7 = local_d7 && bVar5;
            has_node0 = (REF_BOOL)local_d7;
            if (has_node0 == 0) {
              for (face_nodes[2] = 0; face_nodes[2] < pRVar2->face_per;
                  face_nodes[2] = face_nodes[2] + 1) {
                bVar5 = false;
                for (face_nodes[1] = 0; face_nodes[1] < 3; face_nodes[1] = face_nodes[1] + 1) {
                  seg_nodes[(long)face_nodes[1] + 1] =
                       pRVar2->c2n
                       [pRVar2->f2n[face_nodes[1] + face_nodes[2] * 4] + pRVar2->size_per * node];
                  bVar3 = !bVar5;
                  bVar5 = true;
                  if (bVar3) {
                    bVar5 = node1 == seg_nodes[(long)face_nodes[1] + 1];
                  }
                }
                if ((!bVar5) &&
                   (uVar4 = ref_cavity_insert_face(ref_cavity,seg_nodes + 1), uVar4 != 0)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0x62e,"ref_cavity_form_edge_collapse",(ulong)uVar4,"tet face");
                  return uVar4;
                }
              }
            }
          }
          cell_face = pRVar2->ref_adj->item[cell_face].next;
          if (cell_face == -1) {
            local_dc = -1;
          }
          else {
            local_dc = pRVar2->ref_adj->item[cell_face].ref;
          }
          node = local_dc;
        }
        pRVar2 = ref_grid->cell[3];
        if ((node0 < 0) || (pRVar2->ref_adj->nnode <= node0)) {
          local_e0 = -1;
        }
        else {
          local_e0 = pRVar2->ref_adj->first[node0];
        }
        cell_face = local_e0;
        if (local_e0 == -1) {
          local_e4 = -1;
        }
        else {
          local_e4 = pRVar2->ref_adj->item[local_e0].ref;
        }
        node = local_e4;
        while (cell_face != -1) {
          uVar4 = ref_list_contains(ref_cavity->tri_list,node,&has_node1);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x637,"ref_cavity_form_edge_collapse",(ulong)uVar4,"have tet?");
            return uVar4;
          }
          if (has_node1 == 0) {
            uVar4 = ref_list_push(ref_cavity->tri_list,node);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x639,"ref_cavity_form_edge_collapse",(ulong)uVar4,"save tri");
              return uVar4;
            }
            local_e7 = false;
            bVar5 = false;
            for (face_nodes[1] = 0; face_nodes[1] < pRVar2->node_per;
                face_nodes[1] = face_nodes[1] + 1) {
              bVar3 = !local_e7;
              local_e7 = true;
              if (bVar3) {
                local_e7 = node0 == pRVar2->c2n[face_nodes[1] + pRVar2->size_per * node];
              }
              bVar3 = !bVar5;
              bVar5 = true;
              if (bVar3) {
                bVar5 = node1 == pRVar2->c2n[face_nodes[1] + pRVar2->size_per * node];
              }
              if (pRVar1->ref_mpi->id !=
                  pRVar1->part[pRVar2->c2n[face_nodes[1] + pRVar2->size_per * node]]) {
                ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
                return 0;
              }
            }
            local_e7 = local_e7 && bVar5;
            has_node0 = (REF_BOOL)local_e7;
            if (has_node0 == 0) {
              if ((node0 != pRVar2->c2n[pRVar2->size_per * node]) &&
                 (node0 != pRVar2->c2n[pRVar2->size_per * node + 1])) {
                already_have_it = pRVar2->c2n[pRVar2->size_per * node];
                will_be_collapsed = pRVar2->c2n[pRVar2->size_per * node + 1];
                seg_nodes[0] = pRVar2->c2n[pRVar2->size_per * node + 3];
                uVar4 = ref_cavity_insert_seg(ref_cavity,&already_have_it);
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0x64b,"ref_cavity_form_edge_collapse",(ulong)uVar4,"tri 0 side 01");
                  return uVar4;
                }
              }
              if ((node0 != pRVar2->c2n[pRVar2->size_per * node + 1]) &&
                 (node0 != pRVar2->c2n[pRVar2->size_per * node + 2])) {
                already_have_it = pRVar2->c2n[pRVar2->size_per * node + 1];
                will_be_collapsed = pRVar2->c2n[pRVar2->size_per * node + 2];
                seg_nodes[0] = pRVar2->c2n[pRVar2->size_per * node + 3];
                uVar4 = ref_cavity_insert_seg(ref_cavity,&already_have_it);
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0x652,"ref_cavity_form_edge_collapse",(ulong)uVar4,"tri 0 side 12");
                  return uVar4;
                }
              }
              if ((node0 != pRVar2->c2n[pRVar2->size_per * node + 2]) &&
                 (node0 != pRVar2->c2n[pRVar2->size_per * node])) {
                already_have_it = pRVar2->c2n[pRVar2->size_per * node + 2];
                will_be_collapsed = pRVar2->c2n[pRVar2->size_per * node];
                seg_nodes[0] = pRVar2->c2n[pRVar2->size_per * node + 3];
                uVar4 = ref_cavity_insert_seg(ref_cavity,&already_have_it);
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0x659,"ref_cavity_form_edge_collapse",(ulong)uVar4,"tri 0 side 20");
                  return uVar4;
                }
              }
            }
          }
          cell_face = pRVar2->ref_adj->item[cell_face].next;
          if (cell_face == -1) {
            local_ec = -1;
          }
          else {
            local_ec = pRVar2->ref_adj->item[cell_face].ref;
          }
          node = local_ec;
        }
        if ((node1 < 0) || (pRVar2->ref_adj->nnode <= node1)) {
          local_f0 = -1;
        }
        else {
          local_f0 = pRVar2->ref_adj->first[node1];
        }
        cell_face = local_f0;
        if (local_f0 == -1) {
          local_f4 = -1;
        }
        else {
          local_f4 = pRVar2->ref_adj->item[local_f0].ref;
        }
        node = local_f4;
        while (cell_face != -1) {
          uVar4 = ref_list_contains(ref_cavity->tri_list,node,&has_node1);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x660,"ref_cavity_form_edge_collapse",(ulong)uVar4,"have tet?");
            return uVar4;
          }
          if (has_node1 == 0) {
            uVar4 = ref_list_push(ref_cavity->tri_list,node);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x662,"ref_cavity_form_edge_collapse",(ulong)uVar4,"save tri");
              return uVar4;
            }
            local_f7 = false;
            bVar5 = false;
            for (face_nodes[1] = 0; face_nodes[1] < pRVar2->node_per;
                face_nodes[1] = face_nodes[1] + 1) {
              bVar3 = !local_f7;
              local_f7 = true;
              if (bVar3) {
                local_f7 = node0 == pRVar2->c2n[face_nodes[1] + pRVar2->size_per * node];
              }
              bVar3 = !bVar5;
              bVar5 = true;
              if (bVar3) {
                bVar5 = node1 == pRVar2->c2n[face_nodes[1] + pRVar2->size_per * node];
              }
              if (pRVar1->ref_mpi->id !=
                  pRVar1->part[pRVar2->c2n[face_nodes[1] + pRVar2->size_per * node]]) {
                ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
                return 0;
              }
            }
            local_f7 = local_f7 && bVar5;
            has_node0 = (REF_BOOL)local_f7;
            if (has_node0 == 0) {
              if ((node1 != pRVar2->c2n[pRVar2->size_per * node]) &&
                 (node1 != pRVar2->c2n[pRVar2->size_per * node + 1])) {
                already_have_it = pRVar2->c2n[pRVar2->size_per * node];
                will_be_collapsed = pRVar2->c2n[pRVar2->size_per * node + 1];
                seg_nodes[0] = pRVar2->c2n[pRVar2->size_per * node + 3];
                uVar4 = ref_cavity_insert_seg(ref_cavity,&already_have_it);
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0x674,"ref_cavity_form_edge_collapse",(ulong)uVar4,"tri 1 side 01");
                  return uVar4;
                }
              }
              if ((node1 != pRVar2->c2n[pRVar2->size_per * node + 1]) &&
                 (node1 != pRVar2->c2n[pRVar2->size_per * node + 2])) {
                already_have_it = pRVar2->c2n[pRVar2->size_per * node + 1];
                will_be_collapsed = pRVar2->c2n[pRVar2->size_per * node + 2];
                seg_nodes[0] = pRVar2->c2n[pRVar2->size_per * node + 3];
                uVar4 = ref_cavity_insert_seg(ref_cavity,&already_have_it);
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0x67b,"ref_cavity_form_edge_collapse",(ulong)uVar4,"tri 1 side 12");
                  return uVar4;
                }
              }
              if ((node1 != pRVar2->c2n[pRVar2->size_per * node + 2]) &&
                 (node1 != pRVar2->c2n[pRVar2->size_per * node])) {
                already_have_it = pRVar2->c2n[pRVar2->size_per * node + 2];
                will_be_collapsed = pRVar2->c2n[pRVar2->size_per * node];
                seg_nodes[0] = pRVar2->c2n[pRVar2->size_per * node + 3];
                uVar4 = ref_cavity_insert_seg(ref_cavity,&already_have_it);
                if (uVar4 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0x682,"ref_cavity_form_edge_collapse",(ulong)uVar4,"tri 1 side 20");
                  return uVar4;
                }
              }
            }
          }
          cell_face = pRVar2->ref_adj->item[cell_face].next;
          if (cell_face == -1) {
            local_fc = -1;
          }
          else {
            local_fc = pRVar2->ref_adj->item[cell_face].ref;
          }
          node = local_fc;
        }
        ref_cavity_local._4_4_ = ref_cavity_verify_face_manifold(ref_cavity);
        if (ref_cavity_local._4_4_ == 0) {
          ref_cavity_local._4_4_ = ref_cavity_verify_seg_manifold(ref_cavity);
          if (ref_cavity_local._4_4_ == 0) {
            ref_cavity_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x691,"ref_cavity_form_edge_collapse",(ulong)ref_cavity_local._4_4_,
                   "collapse seg manifold");
            printf("at %f %f %f\n",pRVar1->real[ref_cavity->node * 0xf],
                   pRVar1->real[ref_cavity->node * 0xf + 1],pRVar1->real[ref_cavity->node * 0xf + 2]
                  );
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x68b,"ref_cavity_form_edge_collapse",(ulong)ref_cavity_local._4_4_,
                 "collapse face manifold");
          printf("at %f %f %f\n",pRVar1->real[ref_cavity->node * 0xf],
                 pRVar1->real[ref_cavity->node * 0xf + 1],pRVar1->real[ref_cavity->node * 0xf + 2]);
        }
      }
      else {
        ref_cavity->state = REF_CAVITY_MANIFOLD_CONSTRAINED;
        ref_cavity_local._4_4_ = 0;
      }
    }
    else {
      ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
      ref_cavity_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x5e6,
           "ref_cavity_form_edge_collapse",(ulong)ref_cavity_local._4_4_,"init form empty");
  }
  return ref_cavity_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_edge_collapse(REF_CAVITY ref_cavity,
                                                 REF_GRID ref_grid,
                                                 REF_INT node0, REF_INT node1) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell;

  REF_INT cell_face;
  REF_INT node, face_nodes[3], seg_nodes[3];
  REF_BOOL will_be_collapsed, already_have_it;
  REF_BOOL has_node0, has_node1;

  RSS(ref_cavity_form_empty(ref_cavity, ref_grid, node0), "init form empty");
  if (!ref_node_owned(ref_node, node0) || !ref_node_owned(ref_node, node1)) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  /* mixed element protections are not mature */
  if (ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cavity->collapse_node0 = node0;
  ref_cavity->collapse_node1 = node1;

  ref_cell = ref_grid_tet(ref_grid);

  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    if (already_have_it) continue;
    RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), cell), "save tet");
    has_node0 = REF_FALSE;
    has_node1 = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, node) {
      has_node0 = has_node0 || (node0 == ref_cell_c2n(ref_cell, node, cell));
      has_node1 = has_node1 || (node1 == ref_cell_c2n(ref_cell, node, cell));
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
    }
    will_be_collapsed = has_node0 && has_node1;
    if (will_be_collapsed) continue;
    each_ref_cell_cell_face(ref_cell, cell_face) {
      has_node0 = REF_FALSE;
      each_ref_cavity_face_node(ref_cavity, node) {
        face_nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
        has_node0 = has_node0 || (node0 == face_nodes[node]);
      }
      if (!has_node0)
        RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet face");
    }
  }

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    if (already_have_it) continue;
    RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), cell), "save tet");
    has_node0 = REF_FALSE;
    has_node1 = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, node) {
      has_node0 = has_node0 || (node0 == ref_cell_c2n(ref_cell, node, cell));
      has_node1 = has_node1 || (node1 == ref_cell_c2n(ref_cell, node, cell));
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
    }
    will_be_collapsed = has_node0 && has_node1;
    if (will_be_collapsed) continue;
    each_ref_cell_cell_face(ref_cell, cell_face) {
      has_node1 = REF_FALSE;
      each_ref_cavity_face_node(ref_cavity, node) {
        face_nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
        has_node1 = has_node1 || (node1 == face_nodes[node]);
      }
      if (!has_node1)
        RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet face");
    }
  }

  ref_cell = ref_grid_tri(ref_grid);

  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    if (already_have_it) continue;
    RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), cell), "save tri");
    has_node0 = REF_FALSE;
    has_node1 = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, node) {
      has_node0 = has_node0 || (node0 == ref_cell_c2n(ref_cell, node, cell));
      has_node1 = has_node1 || (node1 == ref_cell_c2n(ref_cell, node, cell));
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
    }
    will_be_collapsed = has_node0 && has_node1;
    if (will_be_collapsed) continue;
    if (node0 != ref_cell_c2n(ref_cell, 0, cell) &&
        node0 != ref_cell_c2n(ref_cell, 1, cell)) {
      seg_nodes[0] = ref_cell_c2n(ref_cell, 0, cell);
      seg_nodes[1] = ref_cell_c2n(ref_cell, 1, cell);
      seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri 0 side 01");
    }
    if (node0 != ref_cell_c2n(ref_cell, 1, cell) &&
        node0 != ref_cell_c2n(ref_cell, 2, cell)) {
      seg_nodes[0] = ref_cell_c2n(ref_cell, 1, cell);
      seg_nodes[1] = ref_cell_c2n(ref_cell, 2, cell);
      seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri 0 side 12");
    }
    if (node0 != ref_cell_c2n(ref_cell, 2, cell) &&
        node0 != ref_cell_c2n(ref_cell, 0, cell)) {
      seg_nodes[0] = ref_cell_c2n(ref_cell, 2, cell);
      seg_nodes[1] = ref_cell_c2n(ref_cell, 0, cell);
      seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri 0 side 20");
    }
  }

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    if (already_have_it) continue;
    RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), cell), "save tri");
    has_node0 = REF_FALSE;
    has_node1 = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, node) {
      has_node0 = has_node0 || (node0 == ref_cell_c2n(ref_cell, node, cell));
      has_node1 = has_node1 || (node1 == ref_cell_c2n(ref_cell, node, cell));
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
    }
    will_be_collapsed = has_node0 && has_node1;
    if (will_be_collapsed) continue;
    if (node1 != ref_cell_c2n(ref_cell, 0, cell) &&
        node1 != ref_cell_c2n(ref_cell, 1, cell)) {
      seg_nodes[0] = ref_cell_c2n(ref_cell, 0, cell);
      seg_nodes[1] = ref_cell_c2n(ref_cell, 1, cell);
      seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri 1 side 01");
    }
    if (node1 != ref_cell_c2n(ref_cell, 1, cell) &&
        node1 != ref_cell_c2n(ref_cell, 2, cell)) {
      seg_nodes[0] = ref_cell_c2n(ref_cell, 1, cell);
      seg_nodes[1] = ref_cell_c2n(ref_cell, 2, cell);
      seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri 1 side 12");
    }
    if (node1 != ref_cell_c2n(ref_cell, 2, cell) &&
        node1 != ref_cell_c2n(ref_cell, 0, cell)) {
      seg_nodes[0] = ref_cell_c2n(ref_cell, 2, cell);
      seg_nodes[1] = ref_cell_c2n(ref_cell, 0, cell);
      seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri 1 side 20");
    }
  }

  RSB(ref_cavity_verify_face_manifold(ref_cavity), "collapse face manifold", {
    printf("at %f %f %f\n",
           ref_node_xyz(ref_node, 0, ref_cavity_node(ref_cavity)),
           ref_node_xyz(ref_node, 1, ref_cavity_node(ref_cavity)),
           ref_node_xyz(ref_node, 2, ref_cavity_node(ref_cavity)));
  });
  RSB(ref_cavity_verify_seg_manifold(ref_cavity), "collapse seg manifold", {
    printf("at %f %f %f\n",
           ref_node_xyz(ref_node, 0, ref_cavity_node(ref_cavity)),
           ref_node_xyz(ref_node, 1, ref_cavity_node(ref_cavity)),
           ref_node_xyz(ref_node, 2, ref_cavity_node(ref_cavity)));
  });

  return REF_SUCCESS;
}